

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type __thiscall QList<QTableWidgetItem_*>::takeFirst(QList<QTableWidgetItem_*> *this)

{
  QTableWidgetItem **ppQVar1;
  QPodArrayOps<QTableWidgetItem_*> *this_00;
  QArrayDataPointer<QTableWidgetItem_*> *in_RDI;
  value_type v;
  QList<QTableWidgetItem_*> *in_stack_fffffffffffffff0;
  QTableWidgetItem *pQVar2;
  
  ppQVar1 = first(in_stack_fffffffffffffff0);
  pQVar2 = *ppQVar1;
  this_00 = (QPodArrayOps<QTableWidgetItem_*> *)
            QArrayDataPointer<QTableWidgetItem_*>::operator->(in_RDI);
  QtPrivate::QPodArrayOps<QTableWidgetItem_*>::eraseFirst(this_00);
  return pQVar2;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }